

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::UserParser::ProcessLine(UserParser *this)

{
  cmCTestP4 *pcVar1;
  bool bVar2;
  mapped_type *this_00;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_b8;
  undefined1 local_98 [8];
  User NewUser;
  UserParser *this_local;
  
  NewUser.AccessTime.field_2._8_8_ = this;
  bVar2 = cmsys::RegularExpression::find(&this->RegexUser,&(this->super_LineParser).Line);
  if (bVar2) {
    User::User((User *)local_98);
    cmsys::RegularExpression::match_abi_cxx11_(&local_b8,&this->RegexUser,1);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    cmsys::RegularExpression::match_abi_cxx11_(&local_e8,&this->RegexUser,2);
    std::__cxx11::string::operator=
              ((string *)(NewUser.Name.field_2._M_local_buf + 8),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    cmsys::RegularExpression::match_abi_cxx11_(&local_108,&this->RegexUser,3);
    std::__cxx11::string::operator=
              ((string *)(NewUser.UserName.field_2._M_local_buf + 8),(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    cmsys::RegularExpression::match_abi_cxx11_(&local_128,&this->RegexUser,4);
    std::__cxx11::string::operator=
              ((string *)(NewUser.EMail.field_2._M_local_buf + 8),(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pcVar1 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&local_148,&this->RegexUser,1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
              ::operator[](&pcVar1->Users,&local_148);
    User::operator=(this_00,(User *)local_98);
    std::__cxx11::string::~string((string *)&local_148);
    User::~User((User *)local_98);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexUser.find(this->Line))
      {
      User NewUser;

      NewUser.UserName = this->RegexUser.match(1);
      NewUser.EMail = this->RegexUser.match(2);
      NewUser.Name = this->RegexUser.match(3);
      NewUser.AccessTime = this->RegexUser.match(4);
      P4->Users[this->RegexUser.match(1)] = NewUser;

      return false;
      }
    return true;
    }